

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void samplePushPrevious(Stat4Accum *p,int iChng)

{
  tRowcnt *ptVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  Stat4Sample *pNew;
  
  iVar3 = p->nCol;
  if (iChng <= iVar3 + -2) {
    lVar6 = (long)iVar3 + -1;
    lVar5 = (long)iVar3 * 0x30 + -0x60;
    do {
      pNew = (Stat4Sample *)((long)&p->aBest->anEq + lVar5);
      *(tRowcnt *)(*(long *)((long)&p->aBest->anEq + lVar5) + -4 + lVar6 * 4) =
           (p->current).anEq[lVar6 + -1];
      if (p->nSample < p->mxSample) {
LAB_001a9cfd:
        sampleInsert(p,pNew,(int)lVar6 + -1);
      }
      else {
        iVar3 = sampleIsBetter(p,pNew,p->a + p->iMin);
        if (iVar3 != 0) goto LAB_001a9cfd;
      }
      lVar6 = lVar6 + -1;
      lVar5 = lVar5 + -0x30;
    } while (iChng < lVar6);
  }
  if (iChng < p->nMaxEqZero) {
    if (0 < p->nSample) {
      iVar3 = p->nCol;
      uVar4 = (ulong)(uint)p->nSample;
      do {
        if (iChng < iVar3) {
          ptVar1 = p->a[uVar4 - 1].anEq;
          lVar5 = (long)iChng;
          do {
            if (ptVar1[lVar5] == 0) {
              ptVar1[lVar5] = (p->current).anEq[lVar5];
              iVar3 = p->nCol;
            }
            lVar5 = lVar5 + 1;
          } while (lVar5 < iVar3);
        }
        bVar2 = 1 < (long)uVar4;
        uVar4 = uVar4 - 1;
      } while (bVar2);
    }
    p->nMaxEqZero = iChng;
  }
  return;
}

Assistant:

static void samplePushPrevious(Stat4Accum *p, int iChng){
#ifdef SQLITE_ENABLE_STAT4
  int i;

  /* Check if any samples from the aBest[] array should be pushed
  ** into IndexSample.a[] at this point.  */
  for(i=(p->nCol-2); i>=iChng; i--){
    Stat4Sample *pBest = &p->aBest[i];
    pBest->anEq[i] = p->current.anEq[i];
    if( p->nSample<p->mxSample || sampleIsBetter(p, pBest, &p->a[p->iMin]) ){
      sampleInsert(p, pBest, i);
    }
  }

  /* Check that no sample contains an anEq[] entry with an index of
  ** p->nMaxEqZero or greater set to zero. */
  for(i=p->nSample-1; i>=0; i--){
    int j;
    for(j=p->nMaxEqZero; j<p->nCol; j++) assert( p->a[i].anEq[j]>0 );
  }

  /* Update the anEq[] fields of any samples already collected. */
  if( iChng<p->nMaxEqZero ){
    for(i=p->nSample-1; i>=0; i--){
      int j;
      for(j=iChng; j<p->nCol; j++){
        if( p->a[i].anEq[j]==0 ) p->a[i].anEq[j] = p->current.anEq[j];
      }
    }
    p->nMaxEqZero = iChng;
  }
#endif

#if defined(SQLITE_ENABLE_STAT3) && !defined(SQLITE_ENABLE_STAT4)
  if( iChng==0 ){
    tRowcnt nLt = p->current.anLt[0];
    tRowcnt nEq = p->current.anEq[0];

    /* Check if this is to be a periodic sample. If so, add it. */
    if( (nLt/p->nPSample)!=(nLt+nEq)/p->nPSample ){
      p->current.isPSample = 1;
      sampleInsert(p, &p->current, 0);
      p->current.isPSample = 0;
    }else 

    /* Or if it is a non-periodic sample. Add it in this case too. */
    if( p->nSample<p->mxSample 
     || sampleIsBetter(p, &p->current, &p->a[p->iMin]) 
    ){
      sampleInsert(p, &p->current, 0);
    }
  }
#endif

#ifndef SQLITE_ENABLE_STAT3_OR_STAT4
  UNUSED_PARAMETER( p );
  UNUSED_PARAMETER( iChng );
#endif
}